

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

void __thiscall absl::lts_20250127::cord_internal::CordRepBtree::AlignBegin(CordRepBtree *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(this->super_CordRep).storage[1];
  if (uVar2 != 0) {
    uVar1 = (this->super_CordRep).storage[2] - uVar2;
    (this->super_CordRep).storage[1] = '\0';
    (this->super_CordRep).storage[2] = (uint8_t)uVar1;
    if (6 < uVar1) {
      __assert_fail("new_end <= kMaxCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2e3,"void absl::cord_internal::CordRepBtree::AlignBegin()");
    }
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      this->edges_[uVar3] = this->edges_[uVar2 + uVar3];
    }
  }
  return;
}

Assistant:

size_t end() const { return static_cast<size_t>(storage[2]); }